

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_3.cpp
# Opt level: O1

string * remove_vowels(string *__return_storage_ptr__,string *line)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  size_type sVar7;
  ostringstream oss;
  char local_1a9;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  sVar2 = line->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (line->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      cVar1 = pcVar3[sVar7];
      iVar5 = tolower((int)cVar1);
      uVar6 = (int)(char)iVar5 - 0x61;
      uVar4 = uVar6 >> 1;
      if ((0xc < (uVar4 | (uint)((uVar6 & 1) != 0) << 0x1f)) ||
         ((0x1495U >> (uVar4 & 0x1f) & 1) == 0)) {
        local_1a9 = cVar1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1a9,1);
      }
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string remove_vowels(const std::string& line)
{
	std::ostringstream oss;
	for (auto& ch : line)
	{
		if (!is_vowel(ch))
		{
			oss << ch;
		}
	}
	return oss.str();
}